

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O3

tm * anon_unknown.dwarf_397847::matchYearMonth(tm *__return_storage_ptr__,tm when,tm *base)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar2 = base->tm_year;
  if (iVar2 < when.tm_year) {
    when.tm_mon = when.tm_year * 0xc + when.tm_mon + iVar2 * -0xc;
    when.tm_year = iVar2;
  }
  else if (when.tm_year < iVar2) {
    when.tm_mon = when.tm_year * 0xc + when.tm_mon + iVar2 * -0xc;
    when.tm_year = iVar2;
  }
  uVar6 = (ulong)(uint)when.tm_mon;
  iVar2 = base->tm_mon;
  if (iVar2 < when.tm_mon) {
    uVar5 = ~when.tm_mon;
    do {
      iVar4 = (int)uVar6;
      if (iVar4 < 0) {
        uVar3 = ~(uVar5 / 0xc);
        iVar2 = iVar4 + (uVar5 / 0xc) * 0xc + 0xc;
      }
      else {
        uVar3 = (uint)(uVar6 / 0xc);
        iVar2 = (int)(uVar6 % 0xc);
      }
      bVar7 = iVar2 == 0;
      if (bVar7) {
        iVar2 = 0xc;
      }
      iVar1 = (uVar3 + when.tm_year) - (uint)bVar7;
      iVar2 = QGregorianCalendar::monthLength(iVar2,(iVar1 - (uint)(iVar1 < -0x76b)) + 0x76c);
      when.tm_mday = when.tm_mday + iVar2;
      uVar6 = (ulong)(iVar4 - 1U);
      iVar2 = base->tm_mon;
      uVar5 = uVar5 + 1;
    } while (iVar2 < (int)(iVar4 - 1U));
  }
  when.tm_mon = (int)uVar6;
  if (when.tm_mon < iVar2) {
    uVar5 = ~when.tm_mon;
    do {
      iVar2 = (int)uVar6;
      if (iVar2 < 0) {
        uVar3 = ~(uVar5 / 0xc);
        iVar4 = iVar2 + (uVar5 / 0xc) * 0xc + 0xc;
      }
      else {
        uVar3 = (uint)(uVar6 / 0xc);
        iVar4 = (int)(uVar6 % 0xc);
      }
      iVar4 = QGregorianCalendar::monthLength
                        (iVar4 + 1,
                         ((uVar3 + when.tm_year) - (uint)((int)(uVar3 + when.tm_year) < -0x76b)) +
                         0x76c);
      when.tm_mday = when.tm_mday - iVar4;
      when.tm_mon = iVar2 + 1;
      uVar6 = (ulong)(uint)when.tm_mon;
      uVar5 = uVar5 - 1;
    } while (when.tm_mon < base->tm_mon);
  }
  __return_storage_ptr__->tm_zone = when.tm_zone;
  __return_storage_ptr__->tm_isdst = when.tm_isdst;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = when._36_4_;
  __return_storage_ptr__->tm_gmtoff = when.tm_gmtoff;
  __return_storage_ptr__->tm_mon = when.tm_mon;
  __return_storage_ptr__->tm_year = when.tm_year;
  __return_storage_ptr__->tm_wday = when.tm_wday;
  __return_storage_ptr__->tm_yday = when.tm_yday;
  __return_storage_ptr__->tm_sec = when.tm_sec;
  __return_storage_ptr__->tm_min = when.tm_min;
  __return_storage_ptr__->tm_hour = when.tm_hour;
  __return_storage_ptr__->tm_mday = when.tm_mday;
  return (tm *)when._0_8_;
}

Assistant:

Q_DECL_COLD_FUNCTION
struct tm matchYearMonth(struct tm when, const struct tm &base)
{
    // Adjust *when to be a denormal representation of the same point in time
    // but with tm_year and tm_mon the same as base. In practice this will
    // represent an adjacent month, so don't worry too much about optimising for
    // any other case; we almost certainly run zero or one iteration of one of
    // the year loops then zero or one iteration of one of the month loops.
    while (when.tm_year > base.tm_year) {
        --when.tm_year;
        when.tm_mon += 12;
    }
    while (when.tm_year < base.tm_year) {
        ++when.tm_year;
        when.tm_mon -= 12;
    }
    Q_ASSERT(when.tm_year == base.tm_year);
    while (when.tm_mon > base.tm_mon) {
        const auto yearMon = QRoundingDown::qDivMod<12>(when.tm_mon);
        int year = yearMon.quotient;
        // We want the month before's Qt month number, which is the tm_mon mod 12:
        int month = yearMon.remainder;
        if (month == 0) {
            --year;
            month = 12;
        }
        year += when.tm_year;
        when.tm_mday += QGregorianCalendar::monthLength(month, qYearFromTmYear(year));
        --when.tm_mon;
    }
    while (when.tm_mon < base.tm_mon) {
        const auto yearMon = QRoundingDown::qDivMod<12>(when.tm_mon);
        // Qt month number is offset from tm_mon by one:
        when.tm_mday -= QGregorianCalendar::monthLength(
            yearMon.remainder + 1, qYearFromTmYear(yearMon.quotient + when.tm_year));
        ++when.tm_mon;
    }
    Q_ASSERT(when.tm_mon == base.tm_mon);
    return when;
}